

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O3

size_t dictionary_datrie_get_all_match_lengths
                 (dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ucs4_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = *word;
  if (uVar5 == 0) {
    return 0;
  }
  lVar2 = *t_dictionary;
  sVar4 = 1;
  sVar3 = 0;
  uVar8 = 0;
  while( true ) {
    iVar1 = *(int *)(lVar2 + uVar8 * 0xc);
    if (iVar1 == -1) {
      return sVar3;
    }
    uVar6 = iVar1 + uVar5;
    if ((int)uVar6 < 0) {
      return sVar3;
    }
    if (*(uint *)((long)t_dictionary + 8) <= uVar6) {
      return sVar3;
    }
    uVar7 = (ulong)uVar6;
    if (uVar8 != (long)*(int *)(lVar2 + 4 + uVar7 * 0xc)) break;
    if (*(int *)(lVar2 + uVar7 * 0xc + 8) != -1) {
      match_length[sVar3] = sVar4;
      sVar3 = sVar3 + 1;
    }
    uVar5 = word[sVar4];
    sVar4 = sVar4 + 1;
    uVar8 = uVar7;
    if (uVar5 == 0) {
      return sVar3;
    }
  }
  return sVar3;
}

Assistant:

size_t dictionary_datrie_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	datrie_dictionary_desc * datrie_dictionary = (datrie_dictionary_desc *) t_dictionary;

	size_t rscnt = 0;

	size_t i, p;
	for (i = 0,p = 0; word[p] && datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;

		if (datrie_dictionary->dat[i].word != -1)
			match_length[rscnt ++] = p + 1;
	}

	return rscnt;
}